

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void kratos::LatchVisitor::check_combinational(CombinationalStmtBlock *stmt)

{
  bool bVar1;
  unordered_map<kratos::Var_*,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>_>_>
  *this;
  reference pvVar2;
  value_type *iter;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_map<kratos::Var_*,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>_>_>
  *__range2;
  unordered_map<kratos::Var_*,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>_>_>
  *vars;
  undefined1 local_90 [8];
  AssignedVarVisitor visitor;
  CombinationalStmtBlock *stmt_local;
  
  visitor.assigned_vars_._M_h._M_single_bucket = (__node_base_ptr)stmt;
  AssignedVarVisitor::AssignedVarVisitor((AssignedVarVisitor *)local_90);
  IRVisitor::visit_root
            ((IRVisitor *)local_90,(IRNode *)visitor.assigned_vars_._M_h._M_single_bucket);
  this = AssignedVarVisitor::assigned_vars((AssignedVarVisitor *)local_90);
  __end2 = std::
           unordered_map<kratos::Var_*,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>_>_>
           ::begin(this);
  iter = (value_type *)
         std::
         unordered_map<kratos::Var_*,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>_>_>
         ::end(this);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2.
                        super__Node_iterator_base<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>,_false>
                       ,(_Node_iterator_base<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>,_false>
                         *)&iter);
    if (!bVar1) break;
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>,_false,_false>
             ::operator*(&__end2);
    check_stmt_block((StmtBlock *)visitor.assigned_vars_._M_h._M_single_bucket,pvVar2->first,
                     &pvVar2->second,true);
    std::__detail::
    _Node_const_iterator<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>,_false,_false>
    ::operator++(&__end2);
  }
  AssignedVarVisitor::~AssignedVarVisitor((AssignedVarVisitor *)local_90);
  return;
}

Assistant:

void static check_combinational(CombinationalStmtBlock* stmt) {
        AssignedVarVisitor visitor;
        visitor.visit_root(stmt);
        const auto& vars = visitor.assigned_vars();
        for (auto const& iter : vars) {
            check_stmt_block(stmt, iter.first, iter.second, true);
        }
    }